

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O3

void matras_alloc_range_overflow_test(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  matras mStack_168;
  matras_view mStack_110;
  matras_view mStack_f0;
  uint uStack_cc;
  matras *pmStack_c8;
  undefined1 local_90 [8];
  matras mat;
  matras_id_t id;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_range_overflow_test");
  plan(2);
  matras_create((matras *)local_90,0x10,&pta_allocator,(matras_stats *)0x0);
  uVar6 = 0xfffffffffffffffc;
  while (pvVar4 = matras_alloc_range((matras *)local_90,(matras_id_t *)((long)&mat.stats + 4),4),
        pvVar4 != (void *)0x0) {
    uVar6 = uVar6 + 4;
    if (uVar6 != mat.stats._4_4_) goto LAB_00103ffb;
    if (0xfb < uVar6) {
      pvVar4 = matras_alloc_range((matras *)local_90,(matras_id_t *)((long)&mat.stats + 4),4);
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc_range(&mat, &id, range_count) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x172
          ,"line %d",0x172);
      _ok((uint)(mat.stats._4_4_ == 0xfc),"id == max_capacity - range_count",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x173
          ,"line %d",0x173);
      matras_destroy((matras *)local_90);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_range_overflow_test");
      check_plan();
      return;
    }
  }
  matras_alloc_range_overflow_test();
LAB_00103ffb:
  matras_alloc_range_overflow_test();
  pmStack_c8 = (matras *)local_90;
  _space(_stdout);
  uVar6 = 0;
  printf("# *** %s ***\n","matras_touch_reserve_test");
  plan(0xe);
  matras_create(&mStack_168,0x10,&pta_allocator,(matras_stats *)0x0);
  matras_create_read_view(&mStack_168,&mStack_110);
  do {
    pvVar4 = matras_alloc(&mStack_168,&uStack_cc);
    if (pvVar4 == (void *)0x0) {
      matras_touch_reserve_test();
LAB_00104589:
      matras_touch_reserve_test();
      goto LAB_0010458e;
    }
    if (uVar6 != uStack_cc) goto LAB_00104589;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x100);
  pvVar4 = matras_alloc(&mStack_168,&uStack_cc);
  iVar5 = 0;
  _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x195,
      "line %d",0x195);
  _ok((uint)(uStack_cc == 0xff),"id == max_capacity - 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x196,
      "line %d",0x196);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_168,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19b,
      "line %d",0x19b);
  matras_touch_reserve(&mStack_168,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19d,
      "line %d",0x19d);
  matras_touch_reserve(&mStack_168,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19f,
      "line %d",0x19f);
  matras_touch_reserve(&mStack_168,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a1,
      "line %d",0x1a1);
  matras_destroy_read_view(&mStack_168,&mStack_110);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_168,0);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a7,
      "line %d",0x1a7);
  matras_touch_reserve(&mStack_168,1);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a9,
      "line %d",0x1a9);
  matras_touch_reserve(&mStack_168,0x80);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ab,
      "line %d",0x1ab);
  matras_touch_reserve(&mStack_168,0x100);
  _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ad,
      "line %d",0x1ad);
  matras_create_read_view(&mStack_168,&mStack_f0);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_168,2);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1b6,
      "line %d",0x1b6);
  matras_touch(&mStack_168,0);
  matras_touch(&mStack_168,uStack_cc);
  _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ba,
      "line %d",0x1ba);
  matras_destroy_read_view(&mStack_168,&mStack_f0);
  matras_create_read_view(&mStack_168,&mStack_f0);
  matras_touch(&mStack_168,uStack_cc >> 1);
  sVar1 = AllocatedCount;
  matras_touch_reserve(&mStack_168,2);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1c7,
      "line %d",0x1c7);
  matras_touch(&mStack_168,0);
  matras_touch(&mStack_168,uStack_cc);
  _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1cb,
      "line %d",0x1cb);
  do {
    uVar2 = rand();
    matras_touch_reserve(&mStack_168,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    uVar2 = uVar2 & 0xff;
    if (uVar2 != 0) {
      do {
        uVar3 = rand();
        matras_touch(&mStack_168,uVar3 & 0xff);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      if (AllocatedCount != sVar1) goto LAB_0010458e;
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 10000);
  iVar5 = 0;
  do {
    matras_destroy_read_view(&mStack_168,&mStack_f0);
    matras_create_read_view(&mStack_168,&mStack_f0);
    uVar2 = rand();
    matras_touch_reserve(&mStack_168,uVar2 & 0xff);
    sVar1 = AllocatedCount;
    uVar2 = uVar2 & 0xff;
    if (uVar2 != 0) {
      do {
        uVar3 = rand();
        matras_touch(&mStack_168,uVar3 & 0xff);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      if (AllocatedCount != sVar1) goto LAB_00104593;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 == 10000) {
      matras_destroy_read_view(&mStack_168,&mStack_f0);
      matras_destroy(&mStack_168);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_touch_reserve_test");
      check_plan();
      return;
    }
  } while( true );
LAB_0010458e:
  matras_touch_reserve_test();
LAB_00104593:
  matras_touch_reserve_test();
  plan(7);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  matras_allocator_create(&pta_allocator,0x40,pta_alloc,pta_free);
  matras_allocator_create(&ver_allocator,0x200,all,dea);
  matras_alloc_test();
  matras_vers_test();
  matras_gh_1145_test();
  matras_stats_test();
  matras_alloc_overflow_test();
  matras_alloc_range_overflow_test();
  matras_touch_reserve_test();
  matras_allocator_destroy(&pta_allocator);
  matras_allocator_destroy(&ver_allocator);
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  check_plan();
  return;
}

Assistant:

void
matras_alloc_range_overflow_test()
{
	header();
	plan(2);

	const size_t range_count = 4;
	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
	for (size_t i = 0; i < max_capacity; i += range_count) {
		void *data = matras_alloc_range(&mat, &id, range_count);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	/* Try to exceed the maximum capacity. */
	ok(matras_alloc_range(&mat, &id, range_count) == NULL);
	ok(id == max_capacity - range_count);
	matras_destroy(&mat);

	footer();
	check_plan();
}